

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_FilePathUtils.cpp
# Opt level: O2

String * axl::io::createTempFile(String *__return_storage_ptr__,StringRef *dir,StringRef *prefix)

{
  size_t sVar1;
  int __fd;
  C *__template;
  char *p;
  String fileName;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_60;
  StringRef local_40;
  
  sVar1 = dir->m_length;
  if (sVar1 == 0) {
    getTempDir();
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase(&local_60,&local_40);
  }
  else {
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase(&local_60,dir);
  }
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase(&fileName,&local_60);
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&local_60);
  if (sVar1 == 0) {
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&local_40);
  }
  if ((fileName.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_length == 0) ||
     (fileName.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_p
      [fileName.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_length - 1] != '/'))
  {
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::append(&fileName,0x2f);
  }
  if (prefix->m_length == 0) {
    p = "tmpXXXXXX";
  }
  else {
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::append(&fileName,prefix);
    p = "XXXXXX";
  }
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::operator+=(&fileName,p);
  __template = sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::p(&fileName);
  __fd = mkstemp(__template);
  if (__fd == -1) {
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).
             m_hdr + 1) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).
             m_length + 1) = 0;
    (__return_storage_ptr__->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p =
         (C *)0x0;
    (__return_storage_ptr__->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_hdr =
         (BufHdr *)0x0;
  }
  else {
    ::close(__fd);
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
              (__return_storage_ptr__,&fileName);
  }
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
            (&fileName.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
  return __return_storage_ptr__;
}

Assistant:

sl::String
createTempFile(
	const sl::StringRef& dir,
	const sl::StringRef& prefix
) {
#if (_AXL_OS_WIN)
	wchar_t buffer_w[MAX_PATH + 1];
	::GetTempFileNameW(
		!dir.isEmpty() ? dir.s2().sz() : getTempDir_w().sz(),
		prefix.s2().szn(),
		0,
		buffer_w
	);

	return buffer_w;
#else
	sl::String fileName = !dir.isEmpty() ? dir : getTempDir();
	if (!fileName.isSuffix('/'))
		fileName += '/';

	if (!prefix.isEmpty()) {
		fileName += prefix;
		fileName += "XXXXXX";
	} else {
		fileName += "tmpXXXXXX";
	}

	int fd = ::mkstemp(fileName.p());
	if (fd == -1)
		return sl::String();

	close(fd);
	return fileName;
#endif
}